

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O1

void cfd::TransactionContextUtil::AddSign<cfd::ConfidentialTransactionContext>
               (ConfidentialTransactionContext *transaction,OutPoint *outpoint,
               vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_params,
               bool insert_witness,bool clear_stack)

{
  pointer pSVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  CfdException *pCVar5;
  pointer pSVar6;
  ScriptElement *pSVar7;
  ScriptElement *element;
  ScriptBuilder builder;
  Txid txid;
  ScriptOperator op_code;
  Script script;
  Script local_240;
  Txid local_208;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [32];
  Script local_1b8 [5];
  ScriptWitness local_88;
  Script local_68;
  
  if (transaction == (ConfidentialTransactionContext *)0x0) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e8._0_8_ = local_1e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"Empty transaction.","");
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1e8);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if ((sign_params->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (sign_params->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_1e8._0_8_ = "cfd_transaction_internal.cpp";
    local_1e8._8_4_ = kOpSuccess252;
    local_1d8._0_8_ = "AddSign";
    core::logger::log<>((CfdSourceLocation *)local_1e8,kCfdLogLevelWarning,
                        "Failed to AddSign. Empty sign_params.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e8._0_8_ = local_1e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"Empty sign_params.","");
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1e8);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  bVar2 = core::OutPoint::IsValid(outpoint);
  if (!bVar2) {
    local_1e8._0_8_ = "cfd_transaction_internal.cpp";
    local_1e8._8_4_ = 0x101;
    local_1d8._0_8_ = "AddSign";
    core::logger::log<>((CfdSourceLocation *)local_1e8,kCfdLogLevelWarning,
                        "Failed to AddSign. Invalid outpoint.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e8._0_8_ = local_1e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"Invalid outpoint.","");
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1e8);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (insert_witness) {
    bVar2 = false;
  }
  else {
    pSVar6 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar6 == pSVar1) {
      bVar2 = false;
    }
    else {
      bVar2 = false;
      do {
        bVar3 = SignParameter::IsOpCode(pSVar6);
        if (bVar3) {
          SignParameter::GetOpCode((ScriptOperator *)local_1e8,pSVar6);
          bVar3 = core::ScriptOperator::IsPushOperator((ScriptOperator *)local_1e8);
          if (bVar3) {
            bVar2 = true;
          }
          local_1e8._0_8_ = &PTR__ScriptOperator_00734d50;
          if ((ScriptElement *)local_1d8._0_8_ != (ScriptElement *)(local_1d8 + 0x10)) {
            operator_delete((void *)local_1d8._0_8_);
          }
        }
        pSVar6 = pSVar6 + 1;
      } while (pSVar6 != pSVar1);
    }
  }
  core::OutPoint::GetTxid(&local_208,outpoint);
  uVar4 = core::OutPoint::GetVout(outpoint);
  uVar4 = (*(transaction->super_ConfidentialTransaction).super_AbstractTransaction.
            _vptr_AbstractTransaction[2])(transaction,&local_208,(ulong)uVar4);
  if (insert_witness) {
    if (clear_stack) {
      core::ConfidentialTransaction::RemoveScriptWitnessStackAll
                (&transaction->super_ConfidentialTransaction,uVar4);
    }
    pSVar6 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar6 != pSVar1) {
      do {
        SignParameter::ConvertToSignature((ByteData *)local_1e8,pSVar6);
        core::ConfidentialTransaction::AddScriptWitnessStack
                  (&local_88,&transaction->super_ConfidentialTransaction,uVar4,(ByteData *)local_1e8
                  );
        local_88._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00735628;
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  (&local_88.witness_stack_);
        if ((ScriptElement *)local_1e8._0_8_ != (ScriptElement *)0x0) {
          operator_delete((void *)local_1e8._0_8_);
        }
        pSVar6 = pSVar6 + 1;
      } while (pSVar6 != pSVar1);
    }
  }
  else {
    core::Script::Script(&local_68);
    if (!clear_stack) {
      core::ConfidentialTransaction::GetTxIn
                ((ConfidentialTxInReference *)local_1e8,&transaction->super_ConfidentialTransaction,
                 uVar4);
      core::Script::Script(&local_240,local_1b8);
      core::Script::operator=(&local_68,&local_240);
      core::Script::~Script(&local_240);
      core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)local_1e8);
    }
    local_240._vptr_Script = (_func_int **)&PTR__ScriptBuilder_00733958;
    local_240.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_240.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_240.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    core::Script::GetElementList
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               local_1e8,&local_68);
    if ((ScriptElement *)local_1e8._0_8_ !=
        (ScriptElement *)CONCAT44(local_1e8._12_4_,local_1e8._8_4_)) {
      pSVar7 = (ScriptElement *)local_1e8._0_8_;
      do {
        core::ScriptBuilder::AppendElement((ScriptBuilder *)&local_240,pSVar7);
        pSVar7 = pSVar7 + 1;
      } while (pSVar7 != (ScriptElement *)CONCAT44(local_1e8._12_4_,local_1e8._8_4_));
    }
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               local_1e8);
    pSVar6 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar6 != pSVar1) {
      do {
        if ((bVar2) && (bVar3 = SignParameter::IsOpCode(pSVar6), bVar3)) {
          SignParameter::GetOpCode((ScriptOperator *)local_1e8,pSVar6);
          core::ScriptBuilder::AppendOperator
                    ((ScriptBuilder *)&local_240,(ScriptOperator *)local_1e8);
          local_1e8._0_8_ = &PTR__ScriptOperator_00734d50;
          pSVar7 = (ScriptElement *)local_1d8._0_8_;
          if ((ScriptElement *)local_1d8._0_8_ != (ScriptElement *)(local_1d8 + 0x10)) {
LAB_0044d56c:
            operator_delete(pSVar7);
          }
        }
        else {
          SignParameter::ConvertToSignature((ByteData *)local_1e8,pSVar6);
          core::ScriptBuilder::AppendData((ScriptBuilder *)&local_240,(ByteData *)local_1e8);
          pSVar7 = (ScriptElement *)local_1e8._0_8_;
          if ((ScriptElement *)local_1e8._0_8_ != (ScriptElement *)0x0) goto LAB_0044d56c;
        }
        pSVar6 = pSVar6 + 1;
      } while (pSVar6 != pSVar1);
    }
    core::ScriptBuilder::Build((Script *)local_1e8,(ScriptBuilder *)&local_240);
    core::ConfidentialTransaction::SetUnlockingScript
              (&transaction->super_ConfidentialTransaction,uVar4,(Script *)local_1e8);
    core::Script::~Script((Script *)local_1e8);
    local_240._vptr_Script = (_func_int **)&PTR__ScriptBuilder_00733958;
    if (local_240.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_240.script_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    core::Script::~Script(&local_68);
  }
  local_208._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_208.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TransactionContextUtil::AddSign(
    Tx* transaction, const OutPoint& outpoint,
    const std::vector<SignParameter>& sign_params, bool insert_witness,
    bool clear_stack) {
  if (transaction == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty transaction.");
  }
  if (sign_params.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to AddSign. Empty sign_params.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty sign_params.");
  }
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddSign. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }

  bool has_op_code = false;
  if (!insert_witness) {
    for (const SignParameter& sign_param : sign_params) {
      if (sign_param.IsOpCode()) {
        ScriptOperator op_code = sign_param.GetOpCode();
        if (op_code.IsPushOperator()) {
          has_op_code = true;
        }
      }
    }
  }
  Txid txid = outpoint.GetTxid();
  uint32_t vout = outpoint.GetVout();
  uint32_t txin_index = transaction->GetTxInIndex(txid, vout);

  if (insert_witness) {
    if (clear_stack) {
      transaction->RemoveScriptWitnessStackAll(txin_index);
    }
    for (const SignParameter& sign_param : sign_params) {
      transaction->AddScriptWitnessStack(
          txin_index, sign_param.ConvertToSignature());
    }
  } else {
    Script script;
    if (!clear_stack) {
      script = transaction->GetTxIn(txin_index).GetUnlockingScript();
    }
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const SignParameter& sign_param : sign_params) {
      if (has_op_code && sign_param.IsOpCode()) {
        // Checking push-operator is performed at the time of registration.
        builder.AppendOperator(sign_param.GetOpCode());
      } else {
        builder.AppendData(sign_param.ConvertToSignature());
      }
    }
    transaction->SetUnlockingScript(txin_index, builder.Build());
  }
}